

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O0

err_t ClusterTimeChanged(matroska_cluster *Cluster)

{
  mkv_timestamp_t Timestamp;
  ebml_context *peVar1;
  bool_t bVar2;
  mkv_timestamp_t mVar3;
  matroska_block *local_30;
  ebml_element *GBlock;
  ebml_element *Elt;
  mkv_timestamp_t BlockTimestamp;
  mkv_timestamp_t ClusterTimestamp;
  matroska_cluster *Cluster_local;
  
  (Cluster->Base).Base.bNeedDataSizeUpdate = '\x01';
  Timestamp = MATROSKA_ClusterTimestamp(Cluster);
  MATROSKA_ClusterSetTimestamp(Cluster,Timestamp);
  GBlock = (ebml_element *)(Cluster->Base).Base.Base.Children;
  do {
    if (GBlock == (ebml_element *)0x0) {
      return 0;
    }
    peVar1 = MATROSKA_getContextBlockGroup();
    bVar2 = EBML_ElementIsType(GBlock,peVar1);
    if (bVar2 == 0) {
      peVar1 = MATROSKA_getContextSimpleBlock();
      bVar2 = EBML_ElementIsType(GBlock,peVar1);
      if ((bVar2 != 0) &&
         (mVar3 = MATROSKA_BlockTimestamp((matroska_block *)GBlock), mVar3 != 0x7fffffffffffffff)) {
        MATROSKA_BlockSetTimestamp((matroska_block *)GBlock,mVar3,Timestamp);
      }
    }
    else {
      for (local_30 = (matroska_block *)(GBlock->Base).Children; local_30 != (matroska_block *)0x0;
          local_30 = (matroska_block *)(local_30->Base).Base.Base.Next) {
        peVar1 = MATROSKA_getContextBlock();
        bVar2 = EBML_ElementIsType((ebml_element *)local_30,peVar1);
        if (bVar2 != 0) {
          mVar3 = MATROSKA_BlockTimestamp(local_30);
          if (mVar3 != 0x7fffffffffffffff) {
            MATROSKA_BlockSetTimestamp(local_30,mVar3,Timestamp);
          }
          break;
        }
        if (local_30 == (matroska_block *)(local_30->Base).Base.Base.Next) {
          __assert_fail("(nodetree*)(GBlock) != ((nodetree*)(GBlock))->Next",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x7a,"err_t ClusterTimeChanged(matroska_cluster *)");
        }
      }
    }
    if (GBlock == (ebml_element *)(GBlock->Base).Next) {
      __assert_fail("(nodetree*)(Elt) != ((nodetree*)(Elt))->Next",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x76,"err_t ClusterTimeChanged(matroska_cluster *)");
    }
    GBlock = (ebml_element *)(GBlock->Base).Next;
  } while( true );
}

Assistant:

static err_t ClusterTimeChanged(matroska_cluster *Cluster)
{
    mkv_timestamp_t ClusterTimestamp;
#if defined(CONFIG_EBML_WRITING)
    mkv_timestamp_t BlockTimestamp;
    ebml_element *Elt, *GBlock;
#endif

    Cluster->Base.Base.bNeedDataSizeUpdate = 1;
    ClusterTimestamp = MATROSKA_ClusterTimestamp(Cluster);
    MATROSKA_ClusterSetTimestamp(Cluster, ClusterTimestamp);
#if defined(CONFIG_EBML_WRITING)
    for (Elt = EBML_MasterChildren(Cluster); Elt; Elt = EBML_MasterNext(Elt))
    {
        if (EBML_ElementIsType(Elt, MATROSKA_getContextBlockGroup()))
        {
            for (GBlock = EBML_MasterChildren(Elt);GBlock;GBlock=EBML_MasterNext(GBlock))
            {
                if (EBML_ElementIsType(GBlock, MATROSKA_getContextBlock()))
                {
                    BlockTimestamp = MATROSKA_BlockTimestamp((matroska_block*)GBlock);
                    if (BlockTimestamp!=INVALID_TIMESTAMP_T)
                        MATROSKA_BlockSetTimestamp((matroska_block*)GBlock, BlockTimestamp, ClusterTimestamp);
                    break;
                }
            }
        }
        else if (EBML_ElementIsType(Elt, MATROSKA_getContextSimpleBlock()))
        {
            BlockTimestamp = MATROSKA_BlockTimestamp((matroska_block*)Elt);
            if (BlockTimestamp!=INVALID_TIMESTAMP_T)
                MATROSKA_BlockSetTimestamp((matroska_block*)Elt, BlockTimestamp, ClusterTimestamp);
        }
    }
#endif
    return ERR_NONE;
}